

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O0

void __thiscall
glslang::TParseVersions::checkDeprecated
          (TParseVersions *this,TSourceLoc *loc,int profileMask,int depVersion,char *featureDesc)

{
  TInfoSink *this_00;
  bool bVar1;
  char *pcVar2;
  TString local_f8;
  pool_allocator<char> local_d0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_50;
  char *local_28;
  char *featureDesc_local;
  int depVersion_local;
  int profileMask_local;
  TSourceLoc *loc_local;
  TParseVersions *this_local;
  
  if (((this->profile & profileMask) != EBadProfile) && (depVersion <= this->version)) {
    local_28 = featureDesc;
    featureDesc_local._0_4_ = depVersion;
    featureDesc_local._4_4_ = profileMask;
    _depVersion_local = loc;
    loc_local = (TSourceLoc *)this;
    if ((this->forwardCompatible & 1U) == 0) {
      bVar1 = suppressWarnings(this);
      pcVar2 = local_28;
      if (!bVar1) {
        this_00 = this->infoSink;
        pool_allocator<char>::pool_allocator(&local_d0);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_c8,pcVar2,&local_d0);
        std::operator+(&local_a0,&local_c8," deprecated in version ");
        String_abi_cxx11_(&local_f8,(glslang *)(ulong)(uint)featureDesc_local,10,depVersion);
        std::operator+(&local_78,&local_a0,&local_f8);
        std::operator+(&local_50,&local_78,"; may be removed in future release");
        pcVar2 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (&local_50);
        TInfoSinkBase::message
                  (&this_00->info,EPrefixWarning,pcVar2,_depVersion_local,
                   (this->messages & EShMsgAbsolutePath) != EShMsgDefault,
                   (this->messages & EShMsgDisplayErrorColumn) != EShMsgDefault);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_50);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_f8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_a0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_c8);
      }
    }
    else {
      (*this->_vptr_TParseVersions[0x2d])
                (this,loc,"deprecated, may be removed in future release",featureDesc,"");
    }
  }
  return;
}

Assistant:

void TParseVersions::checkDeprecated(const TSourceLoc& loc, int profileMask, int depVersion, const char* featureDesc)
{
    if (profile & profileMask) {
        if (version >= depVersion) {
            if (forwardCompatible)
                error(loc, "deprecated, may be removed in future release", featureDesc, "");
            else if (! suppressWarnings())
                infoSink.info.message(EPrefixWarning, (TString(featureDesc) + " deprecated in version " +
                                                       String(depVersion) + "; may be removed in future release").c_str(), 
                                                       loc, messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
        }
    }
}